

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetTrueValue(JsValueRef *trueValue)

{
  JsErrorCode JVar1;
  JsValueRef *local_10;
  JsValueRef *trueValue_local;
  
  local_10 = trueValue;
  JVar1 = ContextAPINoScriptWrapper_NoRecord<JsGetTrueValue::__0>
                    ((anon_class_8_1_655cfb23)&local_10,true,false);
  return JVar1;
}

Assistant:

CHAKRA_API JsGetTrueValue(_Out_ JsValueRef *trueValue)
{
    return ContextAPINoScriptWrapper_NoRecord([&] (Js::ScriptContext *scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(trueValue);

        *trueValue = scriptContext->GetLibrary()->GetTrue();

        return JsNoError;
    },
    /*allowInObjectBeforeCollectCallback*/true);
}